

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void boundaryPM(BPMLists *lists,BPMNode *leaves,size_t numpresent,int c,int num)

{
  uint index;
  int weight;
  BPMNode *pBVar1;
  int sum;
  uint lastindex;
  int num_local;
  int c_local;
  size_t numpresent_local;
  BPMNode *leaves_local;
  BPMLists *lists_local;
  
  index = lists->chains1[c]->index;
  if (c == 0) {
    if (index < numpresent) {
      *lists->chains0 = *lists->chains1;
      pBVar1 = bpmnode_create(lists,leaves[index].weight,index + 1,(BPMNode *)0x0);
      *lists->chains1 = pBVar1;
    }
  }
  else {
    weight = lists->chains0[c + -1]->weight + lists->chains1[c + -1]->weight;
    lists->chains0[c] = lists->chains1[c];
    if ((index < numpresent) && (leaves[index].weight < weight)) {
      pBVar1 = bpmnode_create(lists,leaves[index].weight,index + 1,lists->chains1[c]->tail);
      lists->chains1[c] = pBVar1;
    }
    else {
      pBVar1 = bpmnode_create(lists,weight,index,lists->chains1[c + -1]);
      lists->chains1[c] = pBVar1;
      if (num + 1 < (int)numpresent * 2 + -2) {
        boundaryPM(lists,leaves,numpresent,c + -1,num);
        boundaryPM(lists,leaves,numpresent,c + -1,num);
      }
    }
  }
  return;
}

Assistant:

static void boundaryPM(BPMLists* lists, BPMNode* leaves, size_t numpresent, int c, int num) {
  unsigned lastindex = lists->chains1[c]->index;

  if(c == 0) {
    if(lastindex >= numpresent) return;
    lists->chains0[c] = lists->chains1[c];
    lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, 0);
  } else {
    /*sum of the weights of the head nodes of the previous lookahead chains.*/
    int sum = lists->chains0[c - 1]->weight + lists->chains1[c - 1]->weight;
    lists->chains0[c] = lists->chains1[c];
    if(lastindex < numpresent && sum > leaves[lastindex].weight) {
      lists->chains1[c] = bpmnode_create(lists, leaves[lastindex].weight, lastindex + 1, lists->chains1[c]->tail);
      return;
    }
    lists->chains1[c] = bpmnode_create(lists, sum, lastindex, lists->chains1[c - 1]);
    /*in the end we are only interested in the chain of the last list, so no
    need to recurse if we're at the last one (this gives measurable speedup)*/
    if(num + 1 < (int)(2 * numpresent - 2)) {
      boundaryPM(lists, leaves, numpresent, c - 1, num);
      boundaryPM(lists, leaves, numpresent, c - 1, num);
    }
  }
}